

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QRingChunk>::eraseLast(QGenericArrayOps<QRingChunk> *this)

{
  qsizetype *pqVar1;
  QRingChunk *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  pQVar2 = (this->super_QArrayDataPointer<QRingChunk>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QRingChunk>).size;
  pDVar4 = pQVar2[lVar3 + -1].chunk.d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&(pQVar2[lVar3 + -1].chunk.d.d)->super_QArrayData,1,0x10);
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<QRingChunk>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }